

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

ULONGLONG ConvertBytesToInteger_5(LPBYTE ValueAsBytes)

{
  ULONGLONG Value;
  LPBYTE ValueAsBytes_local;
  
  return (ulong)CONCAT41(CONCAT31(CONCAT21(CONCAT11(*ValueAsBytes,ValueAsBytes[1]),ValueAsBytes[2]),
                                  ValueAsBytes[3]),ValueAsBytes[4]);
}

Assistant:

ULONGLONG ConvertBytesToInteger_5(LPBYTE ValueAsBytes)
{
    ULONGLONG Value = 0;

    Value = (Value << 0x08) | ValueAsBytes[0];
    Value = (Value << 0x08) | ValueAsBytes[1];
    Value = (Value << 0x08) | ValueAsBytes[2];
    Value = (Value << 0x08) | ValueAsBytes[3];
    Value = (Value << 0x08) | ValueAsBytes[4];

    return Value;
}